

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O3

void __thiscall tli_window_manager::TableBox::TableBox(TableBox *this,TableBox *other)

{
  long *plVar1;
  int iVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  TableBox(this,other->rows_,other->cols_);
  iVar4 = this->rows_;
  if (0 < iVar4) {
    iVar2 = this->cols_;
    lVar7 = 0;
    do {
      if (0 < iVar2) {
        lVar6 = 0;
        lVar5 = 0;
        do {
          plVar1 = *(long **)(*(long *)&(other->table_).
                                        super__Vector_base<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar7].
                                        super__Vector_base<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
                                        ._M_impl.super__Vector_impl_data + lVar6);
          if (plVar1 != (long *)0x0) {
            uVar3 = (**(code **)(*plVar1 + 0x10))();
            *(undefined8 *)
             (*(long *)&(this->table_).
                        super__Vector_base<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar7].
                        super__Vector_base<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
                        ._M_impl.super__Vector_impl_data + lVar6) = uVar3;
            iVar2 = this->cols_;
          }
          lVar5 = lVar5 + 1;
          lVar6 = lVar6 + 0x10;
        } while (lVar5 < iVar2);
        iVar4 = this->rows_;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar4);
  }
  return;
}

Assistant:

TableBox::TableBox(const TableBox &other) : TableBox(other.rows_, other.cols_) {
    for (int i = 0; i < rows_; ++i) {
        for (int j = 0; j < cols_; ++j) {
            if (other.table_[i][j].first) {
                table_[i][j].first = other.table_[i][j].first->clone();
            }
        }
    }
}